

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTPPrinter.cpp
# Opt level: O2

void __thiscall
Shell::TPTPPrinter::printWithRole
          (TPTPPrinter *this,string *name,string *role,Unit *u,bool includeSplitLevels)

{
  Unit *u_00;
  ostream *poVar1;
  string body;
  string sStack_38;
  
  u_00 = (Unit *)name;
  getBodyStr_abi_cxx11_(&sStack_38,(TPTPPrinter *)name,u,includeSplitLevels);
  ensureHeadersPrinted(this,u_00);
  poVar1 = this->_tgtStream;
  if (poVar1 == (ostream *)0x0) {
    poVar1 = (ostream *)&std::cout;
  }
  poVar1 = std::operator<<(poVar1,"tff(");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,(string *)role);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  poVar1 = std::operator<<(poVar1,").");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void TPTPPrinter::printWithRole(std::string name, std::string role, Unit* u, bool includeSplitLevels)
{
  std::string body = getBodyStr(u, includeSplitLevels);

  ensureHeadersPrinted(u);
  tgt() << "tff(" << name << ", " << role << ", " << body << ")." << endl;
}